

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::SerializePartialToZeroCopyStream
          (MessageLite *this,ZeroCopyOutputStream *output)

{
  bool bVar1;
  ulong uVar2;
  LogMessage *this_00;
  ZeroCopyOutputStream *in_RSI;
  long *in_RDI;
  EpsCopyOutputStream stream;
  uint8 *target;
  size_t size;
  LogMessage *in_stack_ffffffffffffff08;
  LogMessage *in_stack_ffffffffffffff10;
  EpsCopyOutputStream *in_stack_ffffffffffffff18;
  LogMessage *in_stack_ffffffffffffff20;
  EpsCopyOutputStream local_d0;
  uint8 *local_90 [3];
  string local_78 [16];
  unsigned_long in_stack_ffffffffffffff98;
  LogMessage *in_stack_ffffffffffffffa0;
  bool local_1;
  
  uVar2 = (**(code **)(*in_RDI + 0x48))();
  if (uVar2 < 0x80000000) {
    bVar1 = io::CodedOutputStream::IsDefaultSerializationDeterministic();
    io::EpsCopyOutputStream::EpsCopyOutputStream(&local_d0,in_RSI,bVar1,local_90);
    local_90[0] = (uint8 *)(**(code **)(*in_RDI + 0x60))(in_RDI,local_90[0],&local_d0);
    io::EpsCopyOutputStream::Trim(in_stack_ffffffffffffff18,(uint8 *)in_stack_ffffffffffffff10);
    bVar1 = io::EpsCopyOutputStream::HadError(&local_d0);
    if (bVar1) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff20,(LogLevel)((ulong)in_stack_ffffffffffffff18 >> 0x20),
               (char *)in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    (**(code **)(*in_RDI + 0x10))(local_78);
    internal::LogMessage::operator<<(in_stack_ffffffffffffff10,(string *)in_stack_ffffffffffffff08);
    internal::LogMessage::operator<<(in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08);
    this_00 = internal::LogMessage::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    internal::LogFinisher::operator=((LogFinisher *)this_00,in_stack_ffffffffffffff08);
    std::__cxx11::string::~string(local_78);
    internal::LogMessage::~LogMessage((LogMessage *)0x4189c2);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool MessageLite::SerializePartialToZeroCopyStream(
    io::ZeroCopyOutputStream* output) const {
  const size_t size = ByteSizeLong();  // Force size to be cached.
  if (size > INT_MAX) {
    GOOGLE_LOG(ERROR) << GetTypeName()
               << " exceeded maximum protobuf size of 2GB: " << size;
    return false;
  }

  uint8* target;
  io::EpsCopyOutputStream stream(
      output, io::CodedOutputStream::IsDefaultSerializationDeterministic(),
      &target);
  target = _InternalSerialize(target, &stream);
  stream.Trim(target);
  if (stream.HadError()) return false;
  return true;
}